

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_scan_dquot_scalar(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  char *pcVar9;
  bool bVar10;
  error_flags eVar11;
  Parser *in_RDI;
  char msg_8 [69];
  char msg_7 [67];
  char msg_6 [58];
  char msg_5 [24];
  char msg_4 [56];
  char msg_3 [44];
  char next;
  char curr;
  size_t i;
  bool line_is_blank;
  csubstr line;
  size_t pos;
  size_t numlines;
  bool needs_filter;
  char msg_2 [35];
  char msg_1 [50];
  char msg [41];
  substr s;
  size_t b;
  csubstr ret;
  size_t rnum;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  Parser *in_stack_fffffffffffff858;
  Location *in_stack_fffffffffffff860;
  Location *this_00;
  undefined8 in_stack_fffffffffffff880;
  char c;
  undefined4 in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff88c;
  undefined1 in_stack_fffffffffffff88d;
  undefined1 in_stack_fffffffffffff88e;
  undefined1 in_stack_fffffffffffff88f;
  ulong local_770;
  Parser *in_stack_fffffffffffff8c0;
  pfn_error p_Var12;
  Parser *in_stack_fffffffffffff8f0;
  substr *psVar13;
  bool local_6f4;
  bool local_6f3;
  char local_6f2;
  undefined1 *in_stack_fffffffffffff918;
  Parser *in_stack_fffffffffffff920;
  bool local_682;
  bool local_681;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  size_t local_630;
  Location local_628;
  basic_substring<char> local_5e0;
  char *local_5d0;
  ulong local_5c8;
  char *local_5c0;
  ulong local_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  Parser *local_590;
  char local_588 [72];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  Parser *local_520;
  char local_518 [72];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  Parser *local_4b0;
  char local_4a8 [24];
  basic_substring<char_const> local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  Parser *local_460;
  Parser *in_stack_fffffffffffffba8;
  substr in_stack_fffffffffffffbb0;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  Parser *local_400;
  char local_3f8 [46];
  char local_3ca;
  char local_3c9;
  ulong local_3c8;
  char local_3b9;
  basic_substring<const_char> local_3b8;
  ulong local_3a8;
  ulong local_3a0;
  bool local_391;
  char *local_390;
  ulong local_388;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  Parser *local_360;
  undefined1 local_358 [40];
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  Parser *in_stack_fffffffffffffd00;
  csubstr in_stack_fffffffffffffd08;
  char *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  Parser *local_290;
  char local_288 [48];
  ro_substr local_258;
  char *local_248;
  long local_240;
  basic_substring<char> local_238;
  basic_substring<char> local_228;
  ulong local_218;
  csubstr local_208;
  substr *local_1f8;
  undefined8 *local_1f0;
  basic_substring<char> *local_1e8;
  char **local_1e0;
  basic_substring<char> *local_1d8;
  substr *local_1d0;
  basic_substring<char> *local_1c8;
  basic_substring<char> *local_1c0;
  basic_substring<char> *local_1b8;
  substr *local_1b0;
  basic_substring<char> *local_1a8;
  char **local_1a0;
  char *local_198;
  size_t local_190;
  bool local_181;
  char *local_180;
  undefined4 local_178;
  undefined8 local_170;
  basic_substring<char> *local_168;
  char *local_160;
  ulong local_158;
  char *local_150;
  undefined4 local_148;
  ulong local_140;
  substr *local_138;
  undefined8 local_130;
  undefined8 local_128;
  char *local_120;
  undefined4 local_118;
  ulong local_110;
  substr *local_108;
  char *local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined4 local_e8;
  ulong local_e0;
  substr *local_d8;
  char *local_d0;
  long local_c8;
  char *local_c0;
  undefined4 local_b8;
  ulong local_b0;
  substr *local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  undefined4 local_88;
  ulong local_80;
  substr *local_78;
  char *local_70;
  undefined4 local_68;
  ulong local_60;
  char *local_58;
  undefined4 local_50;
  ulong local_38;
  long local_30;
  basic_substring<char> *local_28;
  char *local_20;
  ulong local_18;
  basic_substring<char> *local_10;
  basic_substring<char> *local_8;
  
  c = (char)((ulong)in_stack_fffffffffffff880 >> 0x38);
  local_218 = (in_RDI->m_state->pos).super_LineCol.offset;
  local_a8 = &in_RDI->m_buf;
  local_b0 = local_218;
  if ((in_RDI->m_buf).len < local_218) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x1533;
    handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  local_228.str = local_a0;
  local_228.len = local_98;
  bVar10 = basic_substring<char>::begins_with(&local_228,' ');
  if (bVar10) {
    local_238 = basic_substring<char>::triml
                          ((basic_substring<char> *)
                           CONCAT17(in_stack_fffffffffffff88f,
                                    CONCAT16(in_stack_fffffffffffff88e,
                                             CONCAT15(in_stack_fffffffffffff88d,
                                                      CONCAT14(in_stack_fffffffffffff88c,
                                                               in_stack_fffffffffffff888)))),c);
    local_228.str = local_238.str;
    local_228.len = local_238.len;
    local_d8 = &in_RDI->m_buf;
    local_e0 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e8 = 0x1533;
      handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    local_248 = local_d0;
    local_240 = local_c8;
    local_258 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x312294)
    ;
    local_198 = local_258.str;
    local_190 = local_258.len;
    local_1a0 = &local_248;
    if (local_240 == 0) {
      local_682 = false;
      if ((local_258.len == 0) && (local_682 = false, local_258.str == local_248)) {
        local_682 = local_248 != (char *)0x0;
      }
      local_181 = local_682;
    }
    else {
      local_681 = local_248 <= local_258.str &&
                  local_258.str + local_258.len <= local_248 + local_240;
      local_181 = local_681;
    }
    if (((local_181 ^ 0xffU) & 1) != 0) {
      memcpy(local_288,"check failed: (m_buf.sub(b).is_super(s))",0x29);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                         CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      in_stack_fffffffffffff848 = (undefined4)local_2a0;
      in_stack_fffffffffffff84c = (undefined4)((ulong)local_2a0 >> 0x20);
      in_stack_fffffffffffff850 = (undefined4)uStack_298;
      in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_298 >> 0x20);
      in_stack_fffffffffffff840 = (undefined4)uStack_2a8;
      in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_2a8 >> 0x20);
      LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
      LVar1.super_LineCol.offset = local_2b0;
      LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
      LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
      LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
      LVar1.name.str._0_4_ = in_stack_fffffffffffff850;
      LVar1.name.str._4_4_ = in_stack_fffffffffffff854;
      LVar1.name.len = (size_t)local_290;
      (*p_Var12)(local_288,0x29,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff858 = local_290;
    }
    pcVar9 = local_228.str;
    local_1d8 = &local_228;
    local_108 = &in_RDI->m_buf;
    local_110 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x1533;
      handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    local_2c0 = local_100;
    local_2b8 = local_f8;
    local_1e0 = &local_2c0;
    if (pcVar9 < local_100) {
      memcpy(&stack0xfffffffffffffd08,"check failed: (s.begin() >= m_buf.sub(b).begin())",0x32);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                         CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      in_stack_fffffffffffff858 = in_stack_fffffffffffffd00;
      in_stack_fffffffffffff848 = (undefined4)local_310;
      in_stack_fffffffffffff84c = (undefined4)((ulong)local_310 >> 0x20);
      in_stack_fffffffffffff850 = (undefined4)uStack_308;
      in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_308 >> 0x20);
      in_stack_fffffffffffff840 = (undefined4)uStack_318;
      in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_318 >> 0x20);
      LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
      LVar2.super_LineCol.offset = local_320;
      LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
      LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
      LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
      LVar2.name.str._0_4_ = in_stack_fffffffffffff850;
      LVar2.name.str._4_4_ = in_stack_fffffffffffff854;
      LVar2.name.len = (size_t)in_stack_fffffffffffff858;
      in_stack_fffffffffffffd00 = in_stack_fffffffffffff858;
      (*p_Var12)(&stack0xfffffffffffffd08,0x32,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    local_1e8 = &local_228;
    local_138 = &in_RDI->m_buf;
    local_140 = local_218;
    if ((in_RDI->m_buf).len < local_218) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_148 = 0x1533;
      handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    local_330 = local_130;
    local_328 = local_128;
    local_1f0 = &local_330;
    _line_progressed(in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
  }
  local_218 = (in_RDI->m_state->pos).super_LineCol.offset;
  bVar10 = basic_substring<char>::begins_with(&local_228,'\"');
  if (!bVar10) {
    memcpy(local_358,"check failed: (s.begins_with(\'\"\'))",0x23);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    in_stack_fffffffffffff920 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffff918 = local_358;
    Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    (*(code *)in_stack_fffffffffffff920)
              (in_stack_fffffffffffff918,0x23,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff840 = uStack_378;
    in_stack_fffffffffffff844 = uStack_374;
    in_stack_fffffffffffff848 = local_370;
    in_stack_fffffffffffff84c = uStack_36c;
    in_stack_fffffffffffff850 = uStack_368;
    in_stack_fffffffffffff854 = uStack_364;
    in_stack_fffffffffffff858 = local_360;
  }
  _line_progressed(in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
  local_168 = &local_228;
  local_170 = 1;
  if (local_228.len == 0) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_178 = 0x1533;
    handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  local_390 = local_160;
  local_388 = local_158;
  local_228.str = local_160;
  local_228.len = local_158;
  local_391 = false;
  local_3a0 = 1;
  local_3a8 = 0xffffffffffffffff;
  while (bVar10 = _finished_file(in_RDI), ((bVar10 ^ 0xffU) & 1) != 0) {
    local_3b8.str = (in_RDI->m_state->line_contents).rem.str;
    local_3b8.len = (in_RDI->m_state->line_contents).rem.len;
    local_3b9 = '\x01';
    for (local_3c8 = 0; local_3c8 < local_3b8.len; local_3c8 = local_3c8 + 1) {
      local_3c9 = local_3b8.str[local_3c8];
      if (local_3c9 != ' ') {
        local_3b9 = '\0';
      }
      if (local_3c9 == '\\') {
        if (local_3c8 + 1 < local_3b8.len) {
          local_6f2 = local_3b8.str[local_3c8 + 1];
        }
        else {
          local_6f2 = '~';
        }
        local_3ca = local_6f2;
        local_391 = true;
        if ((local_6f2 == '\"') || (local_6f2 == '\\')) {
          local_3c8 = local_3c8 + 1;
        }
      }
      else if (local_3c9 == '\"') {
        local_3a8 = local_3c8;
        break;
      }
    }
    local_6f3 = true;
    if ((((local_391 & 1U) == 0) && (local_6f3 = true, local_3a0 < 2)) &&
       (local_6f3 = true, local_3b9 == '\0')) {
      bVar10 = _at_line_begin(in_RDI);
      local_6f4 = false;
      if (bVar10) {
        local_6f4 = basic_substring<const_char>::begins_with(&local_3b8,' ');
      }
      local_6f3 = local_6f4;
    }
    local_391 = local_6f3;
    if (local_3a8 != 0xffffffffffffffff) {
      if ((in_RDI->m_buf).len <= local_3a8) {
        memcpy(local_3f8,"check failed: (pos >= 0 && pos < m_buf.len)",0x2c);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                           CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                           CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
        in_stack_fffffffffffff848 = (undefined4)local_410;
        in_stack_fffffffffffff84c = (undefined4)((ulong)local_410 >> 0x20);
        in_stack_fffffffffffff850 = (undefined4)uStack_408;
        in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_408 >> 0x20);
        in_stack_fffffffffffff840 = (undefined4)uStack_418;
        in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_418 >> 0x20);
        LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
        LVar3.super_LineCol.offset = local_420;
        LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
        LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
        LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
        LVar3.name.str._0_4_ = in_stack_fffffffffffff850;
        LVar3.name.str._4_4_ = in_stack_fffffffffffff854;
        LVar3.name.len = (size_t)local_400;
        (*p_Var12)(local_3f8,0x2c,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff858 = local_400;
      }
      psVar13 = &in_RDI->m_buf;
      local_80 = (in_RDI->m_state->pos).super_LineCol.offset + local_3a8;
      local_78 = psVar13;
      if ((in_RDI->m_buf).len <= local_80) {
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x14c3;
        handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (psVar13->str[local_80] != '\"') {
        memcpy(&stack0xfffffffffffffba8,"check failed: (m_buf[m_state->pos.offset + pos] == \'\"\')"
               ,0x38);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                           CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                           CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
        in_stack_fffffffffffff848 = (undefined4)local_470;
        in_stack_fffffffffffff84c = (undefined4)((ulong)local_470 >> 0x20);
        in_stack_fffffffffffff850 = (undefined4)uStack_468;
        in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_468 >> 0x20);
        in_stack_fffffffffffff840 = (undefined4)uStack_478;
        in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_478 >> 0x20);
        LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
        LVar4.super_LineCol.offset = local_480;
        LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
        LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
        LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
        LVar4.name.str._0_4_ = in_stack_fffffffffffff850;
        LVar4.name.str._4_4_ = in_stack_fffffffffffff854;
        LVar4.name.len = (size_t)local_460;
        (*p_Var12)(&stack0xfffffffffffffba8,0x38,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff858 = local_460;
      }
      _line_progressed(in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
      local_3a8 = ((in_RDI->m_state->pos).super_LineCol.offset - local_218) - 1;
      break;
    }
    _line_progressed(in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
    local_3a0 = local_3a0 + 1;
    _line_ended(in_stack_fffffffffffff8f0);
    _scan_line(in_stack_fffffffffffff8c0);
  }
  if (local_3a8 == 0xffffffffffffffff) {
    bVar10 = is_debugger_attached();
    if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    basic_substring<char_const>::basic_substring<53ul>
              (local_490,(char (*) [53])"ERROR: reached end of file looking for closing quote");
    _err<>(in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
    goto LAB_00313662;
  }
  if (local_3a8 == 0) {
    builtin_strncpy(local_4a8,"check failed: (pos > 0)",0x18);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    in_stack_fffffffffffff848 = (undefined4)local_4c0;
    in_stack_fffffffffffff84c = (undefined4)((ulong)local_4c0 >> 0x20);
    in_stack_fffffffffffff850 = (undefined4)uStack_4b8;
    in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_4b8 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_4c8;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_4c8 >> 0x20);
    LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
    LVar5.super_LineCol.offset = local_4d0;
    LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
    LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
    LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
    LVar5.name.str._0_4_ = in_stack_fffffffffffff850;
    LVar5.name.str._4_4_ = in_stack_fffffffffffff854;
    LVar5.name.len = (size_t)local_4b0;
    (*p_Var12)(local_4a8,0x18,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff858 = local_4b0;
  }
  local_1a8 = &local_228;
  local_1b0 = &in_RDI->m_buf;
  if ((local_228.str + local_228.len != local_1b0->str + (in_RDI->m_buf).len) &&
     (local_1b8 = &local_228, local_228.str[local_228.len] != '\"')) {
    memcpy(local_518,"check failed: (s.end() == m_buf.end() || *s.end() == \'\"\')",0x3a);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    in_stack_fffffffffffff848 = (undefined4)local_530;
    in_stack_fffffffffffff84c = (undefined4)((ulong)local_530 >> 0x20);
    in_stack_fffffffffffff850 = (undefined4)uStack_528;
    in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_528 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_538;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_538 >> 0x20);
    LVar6.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
    LVar6.super_LineCol.offset = local_540;
    LVar6.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
    LVar6.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
    LVar6.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
    LVar6.name.str._0_4_ = in_stack_fffffffffffff850;
    LVar6.name.str._4_4_ = in_stack_fffffffffffff854;
    LVar6.name.len = (size_t)local_520;
    (*p_Var12)(local_518,0x3a,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff858 = local_520;
  }
  local_1c0 = &local_228;
  local_1f8 = &in_RDI->m_buf;
  if (local_228.str + local_228.len < local_1f8->str) {
LAB_003132ea:
    memcpy(local_588,"check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())",0x43);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    in_stack_fffffffffffff848 = (undefined4)local_5a0;
    in_stack_fffffffffffff84c = (undefined4)((ulong)local_5a0 >> 0x20);
    in_stack_fffffffffffff850 = (undefined4)uStack_598;
    in_stack_fffffffffffff854 = (undefined4)((ulong)uStack_598 >> 0x20);
    in_stack_fffffffffffff840 = (undefined4)uStack_5a8;
    in_stack_fffffffffffff844 = (undefined4)((ulong)uStack_5a8 >> 0x20);
    LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffff840;
    LVar7.super_LineCol.offset = local_5b0;
    LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffff844;
    LVar7.super_LineCol.col._0_4_ = in_stack_fffffffffffff848;
    LVar7.super_LineCol.col._4_4_ = in_stack_fffffffffffff84c;
    LVar7.name.str._0_4_ = in_stack_fffffffffffff850;
    LVar7.name.str._4_4_ = in_stack_fffffffffffff854;
    LVar7.name.len = (size_t)local_590;
    (*p_Var12)(local_588,0x43,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff858 = local_590;
  }
  else {
    local_1c8 = &local_228;
    local_1d0 = &in_RDI->m_buf;
    if (local_1d0->str + (in_RDI->m_buf).len < local_228.str + local_228.len) goto LAB_003132ea;
  }
  local_38 = local_3a8 - 1;
  local_28 = &local_228;
  local_30 = 0;
  if (local_228.len < local_38 && local_38 != 0xffffffffffffffff) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x153b;
    handle_error(0x34984b,(char *)0x153b,"check failed: %s",
                 "(num >= 0 && num <= len) || (num == npos)");
  }
  if (local_38 == 0xffffffffffffffff) {
    local_770 = local_228.len - local_30;
  }
  else {
    local_770 = local_38;
  }
  local_60 = local_770;
  if (local_228.len < local_30 + local_770 && local_38 != 0) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x153d;
    handle_error(0x34984b,(char *)0x153d,"check failed: %s",
                 "(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  local_5c0 = local_20;
  local_5b8 = local_18;
  local_228.str = local_20;
  local_228.len = local_18;
LAB_00313662:
  if ((local_391 & 1U) == 0) {
    local_208 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x313866)
    ;
  }
  else {
    local_5d0 = local_228.str;
    local_5c8 = local_228.len;
    local_208 = _filter_dquot_scalar(in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0);
    bVar10 = true;
    if (local_228.len < local_208.len) {
      local_8 = &local_228;
      bVar10 = true;
      if (local_228.len != 0 && local_228.str != (char *)0x0) {
        local_5e0 = basic_substring<char>::trim
                              ((basic_substring<char> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                               (char)((uint)in_stack_fffffffffffff84c >> 0x18));
        local_10 = &local_5e0;
        bVar10 = true;
        if (local_5e0.len != 0) {
          bVar10 = local_5e0.str == (char *)0x0;
        }
      }
    }
    if (!bVar10) {
      memcpy(&local_628,"check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())",
             0x45);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      this_00 = &local_628;
      Location::Location(this_00,(char *)in_stack_fffffffffffff858,
                         CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      LVar8.super_LineCol.line._0_4_ = (int)uStack_648;
      LVar8.super_LineCol.offset = local_650;
      LVar8.super_LineCol.line._4_4_ = (int)((ulong)uStack_648 >> 0x20);
      LVar8.super_LineCol.col._0_4_ = (int)local_640;
      LVar8.super_LineCol.col._4_4_ = (int)((ulong)local_640 >> 0x20);
      LVar8.name.str._0_4_ = (int)uStack_638;
      LVar8.name.str._4_4_ = (int)((ulong)uStack_638 >> 0x20);
      LVar8.name.len = local_630;
      (*p_Var12)((char *)this_00,0x45,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
  }
  return local_208;
}

Assistant:

csubstr Parser::_scan_dquot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('"'));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning double quoted scalar @ line[{}]:  line='{}'", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr != ' ')
                line_is_blank = false;
            // every \ is an escape
            if(curr == '\\')
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                needs_filter = true;
                if(next == '"' || next == '\\')
                    ++i;
            }
            else if(curr == '"')
            {
                pos = i;
                break;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '"');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '"');
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_dquot_scalar(s);
        _c4dbgpf("final scalar: [{}]\"{}\"", ret.len, ret);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}